

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_ls.c
# Opt level: O3

int kinLsFree(KINMem kin_mem)

{
  void *__ptr;
  
  if ((kin_mem != (KINMem)0x0) && (__ptr = kin_mem->kin_lmem, __ptr != (void *)0x0)) {
    *(undefined8 *)((long)__ptr + 0x20) = 0;
    if (*(code **)((long)__ptr + 0x88) != (code *)0x0) {
      (**(code **)((long)__ptr + 0x88))(kin_mem);
      __ptr = kin_mem->kin_lmem;
    }
    free(__ptr);
  }
  return 0;
}

Assistant:

int kinLsFree(KINMem kin_mem)
{
  KINLsMem kinls_mem;

  /* Return immediately if kin_mem or kin_mem->kin_lmem are NULL */
  if (kin_mem == NULL) return (KINLS_SUCCESS);
  if (kin_mem->kin_lmem == NULL) return(KINLS_SUCCESS);
  kinls_mem = (KINLsMem) kin_mem->kin_lmem;

  /* Nullify SUNMatrix pointer */
  kinls_mem->J = NULL;

  /* Free preconditioner memory (if applicable) */
  if (kinls_mem->pfree) kinls_mem->pfree(kin_mem);

  /* free KINLs interface structure */
  free(kin_mem->kin_lmem);

  return(KINLS_SUCCESS);
}